

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::run_creation_work_item_setup_graphics
          (ThreadedReplayer *this,PipelineWorkItem *work_item)

{
  bool bVar1;
  PerThreadData *pPVar2;
  pointer this_00;
  FeatureFilter *this_01;
  PerThreadData *per_thread;
  PipelineWorkItem *work_item_local;
  ThreadedReplayer *this_local;
  
  pPVar2 = get_per_thread_data(this);
  pPVar2->current_graphics_index = work_item->index + 1;
  pPVar2->current_graphics_pipeline = work_item->hash;
  if ((work_item->create_info).graphics_create_info == (VkGraphicsPipelineCreateInfo *)0x0) {
    fprintf(_stderr,"Fossilize ERROR: Invalid graphics create info.\n");
    fflush(_stderr);
    this_local._7_1_ = false;
  }
  else if (((((work_item->create_info).graphics_create_info)->flags & 4) == 0) ||
          (((work_item->create_info).graphics_create_info)->basePipelineHandle != (VkPipeline)0x0))
  {
    this_00 = std::
              unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
              operator->(&this->device);
    this_01 = Fossilize::VulkanDevice::get_feature_filter(this_00);
    bVar1 = Fossilize::FeatureFilter::graphics_pipeline_is_supported
                      (this_01,(work_item->create_info).graphics_create_info);
    if (bVar1) {
      mark_currently_active_modules
                (this,((work_item->create_info).graphics_create_info)->pStages,
                 ((work_item->create_info).graphics_create_info)->stageCount);
      this_local._7_1_ = true;
    }
    else {
      fprintf(_stderr,
              "Fossilize WARN: Graphics pipeline %016lx is not supported by current device, skipping.\n"
              ,work_item->hash);
      fflush(_stderr);
      this_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Invalid derivative pipeline!\n");
    fflush(_stderr);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool run_creation_work_item_setup_graphics(const PipelineWorkItem &work_item)
	{
		auto &per_thread = get_per_thread_data();
		per_thread.current_graphics_index = work_item.index + 1;
		per_thread.current_graphics_pipeline = work_item.hash;

		if (!work_item.create_info.graphics_create_info)
		{
			LOGE("Invalid graphics create info.\n");
			return false;
		}

		if ((work_item.create_info.graphics_create_info->flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
		    work_item.create_info.graphics_create_info->basePipelineHandle == VK_NULL_HANDLE)
		{
			// This pipeline failed for some reason, don't try to compile this one either.
			LOGE("Invalid derivative pipeline!\n");
			return false;
		}

		if (!device->get_feature_filter().graphics_pipeline_is_supported(work_item.create_info.graphics_create_info))
		{
			LOGW("Graphics pipeline %016" PRIx64 " is not supported by current device, skipping.\n", work_item.hash);
			return false;
		}

		mark_currently_active_modules(work_item.create_info.graphics_create_info->pStages,
		                              work_item.create_info.graphics_create_info->stageCount);

		return true;
	}